

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O3

void __thiscall
antlr::RefCount<antlr::ParserInputState>::~RefCount(RefCount<antlr::ParserInputState> *this)

{
  uint *puVar1;
  Ref *pRVar2;
  
  pRVar2 = this->ref;
  if (pRVar2 != (Ref *)0x0) {
    puVar1 = &pRVar2->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      if (pRVar2->ptr != (ParserInputState *)0x0) {
        (*pRVar2->ptr->_vptr_ParserInputState[1])();
      }
      operator_delete(pRVar2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~RefCount()
	{
		if (ref && ref->decrement())
			delete ref;
	}